

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_uuencode.c
# Opt level: O0

void test_write_filter_uuencode(void)

{
  undefined8 uVar1;
  int iVar2;
  wchar_t wVar3;
  void *buff_00;
  void *__s;
  archive *paVar4;
  char *pcVar5;
  la_ssize_t lVar6;
  la_int64_t lVar7;
  uint local_5c;
  size_t sStack_58;
  int i;
  size_t used2;
  size_t used1;
  char path [16];
  size_t datasize;
  size_t buffsize;
  char *data;
  char *buff;
  archive *a;
  archive_entry *ae;
  
  buff_00 = malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L',',(uint)(buff_00 != (void *)0x0),"NULL != (buff = malloc(buffsize))",
                   (void *)0x0);
  path[8] = '\x10';
  path[9] = '\'';
  path[10] = '\0';
  path[0xb] = '\0';
  path[0xc] = '\0';
  path[0xd] = '\0';
  path[0xe] = '\0';
  path[0xf] = '\0';
  __s = malloc(10000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'/',(uint)(__s != (void *)0x0),"NULL != (data = malloc(datasize))",(void *)0x0)
  ;
  memset(__s,0,path._8_8_);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'5',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'6',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",paVar4);
  iVar2 = archive_write_add_filter_uuencode(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'7',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_uuencode(a)",paVar4
                     );
  iVar2 = archive_write_set_bytes_per_block(paVar4,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'9',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_bytes_per_block(a, 10)",
                      paVar4);
  iVar2 = archive_filter_code(paVar4,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L':',7,"ARCHIVE_FILTER_UU",(long)iVar2,"archive_filter_code(a, 0)",
                      (void *)0x0);
  pcVar5 = archive_filter_name(paVar4,0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
             ,L';',"uuencode","\"uuencode\"",pcVar5,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
  iVar2 = archive_write_open_memory(paVar4,buff_00,2000000,&used2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'=',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_open_memory(a, buff, buffsize, &used1)",paVar4);
  for (local_5c = 0; (int)local_5c < 99; local_5c = local_5c + 1) {
    a = (archive *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                     ,L'?',(uint)((archive_entry *)a != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_filetype((archive_entry *)a,0x8000);
    archive_entry_set_size((archive_entry *)a,path._8_8_);
    snprintf((char *)&used1,0x10,"file%03d");
    archive_entry_copy_pathname((archive_entry *)a,(char *)&used1);
    iVar2 = archive_write_header(paVar4,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                        ,L'D',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4);
    uVar1 = path._8_8_;
    lVar6 = archive_write_data(paVar4,__s,path._8_8_);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                     ,L'F',(uint)(uVar1 == lVar6),
                     "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
    archive_entry_free((archive_entry *)a);
  }
  iVar2 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'I',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'L',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'M',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",paVar4);
  iVar2 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'N',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",paVar4);
  iVar2 = archive_read_open_memory(paVar4,buff_00,used2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'O',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_memory(a, buff, used1)",
                      paVar4);
  for (local_5c = 0; (int)local_5c < 99; local_5c = local_5c + 1) {
    snprintf((char *)&used1,0x10,"file%03d");
    iVar2 = archive_read_next_header(paVar4,(archive_entry **)&a);
    wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                                ,L'R',0,"0",(long)iVar2,"archive_read_next_header(a, &ae)",paVar4);
    if (wVar3 == L'\0') break;
    pcVar5 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
               ,L'T',(char *)&used1,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar2 = (int)path._8_8_;
    lVar7 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                        ,L'U',(long)iVar2,"(int)datasize",lVar7,"archive_entry_size(ae)",(void *)0x0
                       );
  }
  iVar2 = archive_filter_code(paVar4,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'W',7,"ARCHIVE_FILTER_UU",(long)iVar2,"archive_filter_code(a, 0)",
                      (void *)0x0);
  iVar2 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'X',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
  iVar2 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'Y',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'_',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",paVar4);
  iVar2 = archive_write_set_bytes_per_block(paVar4,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'b',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_bytes_per_block(a, 10)",
                      paVar4);
  iVar2 = archive_write_add_filter_uuencode(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'c',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_uuencode(a)",paVar4
                     );
  iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"nonexistent-option","0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'e',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                      "archive_write_set_filter_option(a, NULL, \"nonexistent-option\", \"0\")",
                      paVar4);
  iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","abc");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'g',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                      "archive_write_set_filter_option(a, NULL, \"compression-level\", \"abc\")",
                      paVar4);
  iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","99");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'i',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                      "archive_write_set_filter_option(a, NULL, \"compression-level\", \"99\")",
                      paVar4);
  iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"name","test.tar");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'k',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_filter_option(a, NULL, \"name\", \"test.tar\")",paVar4);
  iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"mode","0640");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'm',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_filter_option(a, NULL, \"mode\", \"0640\")",paVar4);
  iVar2 = archive_write_open_memory(paVar4,buff_00,2000000,&stack0xffffffffffffffa8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'o',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
  for (local_5c = 0; (int)local_5c < 99; local_5c = local_5c + 1) {
    snprintf((char *)&used1,0x10,"file%03d",(ulong)local_5c);
    a = (archive *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                     ,L'r',(uint)((archive_entry *)a != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname((archive_entry *)a,(char *)&used1);
    archive_entry_set_size((archive_entry *)a,path._8_8_);
    archive_entry_set_filetype((archive_entry *)a,0x8000);
    iVar2 = archive_write_header(paVar4,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                        ,L'v',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4);
    uVar1 = path._8_8_;
    lVar6 = archive_write_data(paVar4,__s,path._8_8_);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                     ,L'w',(uint)(uVar1 == lVar6),
                     "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
    archive_entry_free((archive_entry *)a);
  }
  iVar2 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'z',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'{',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'}',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'~',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",paVar4);
  iVar2 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x7f',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",
                      paVar4);
  iVar2 = archive_read_open_memory(paVar4,buff_00,sStack_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x80',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_memory(a, buff, used2)"
                      ,paVar4);
  for (local_5c = 0; (int)local_5c < 99; local_5c = local_5c + 1) {
    snprintf((char *)&used1,0x10,"file%03d",(ulong)local_5c);
    iVar2 = archive_read_next_header(paVar4,(archive_entry **)&a);
    wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                                ,L'\x83',0,"0",(long)iVar2,"archive_read_next_header(a, &ae)",
                                (void *)0x0);
    if (wVar3 == L'\0') break;
    pcVar5 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
               ,L'\x85',(char *)&used1,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
    ;
    iVar2 = (int)path._8_8_;
    lVar7 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                        ,L'\x86',(long)iVar2,"(int)datasize",lVar7,"archive_entry_size(ae)",
                        (void *)0x0);
  }
  iVar2 = archive_filter_code(paVar4,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x88',7,"ARCHIVE_FILTER_UU",(long)iVar2,"archive_filter_code(a, 0)",
                      (void *)0x0);
  iVar2 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x89',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
  iVar2 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x8a',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'\x90',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_add_filter_uuencode(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x91',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_uuencode(a)",
                      paVar4);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x92',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'\x94',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_add_filter_uuencode(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x95',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_uuencode(a)",
                      paVar4);
  iVar2 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x96',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",(void *)0x0);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x97',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'\x99',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x9a',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",paVar4
                     );
  iVar2 = archive_write_add_filter_uuencode(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x9b',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_uuencode(a)",
                      paVar4);
  iVar2 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x9c',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",(void *)0x0);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\x9d',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                   ,L'\x9f',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_set_format_ustar(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'\xa0',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",paVar4
                     );
  iVar2 = archive_write_add_filter_uuencode(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'¡',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_uuencode(a)",
                      paVar4);
  iVar2 = archive_write_open_memory(paVar4,buff_00,2000000,&stack0xffffffffffffffa8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'£',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
  iVar2 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'¤',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",(void *)0x0);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_uuencode.c"
                      ,L'¥',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  free(__s);
  free(buff_00);
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_uuencode)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i;

	buffsize = 2000000;
	assert(NULL != (buff = malloc(buffsize)));

	datasize = 10000;
	assert(NULL != (data = malloc(datasize)));
	memset(data, 0, datasize);

	/*
	 * Write a 100 files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_uuencode(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_UU, archive_filter_code(a, 0));
	assertEqualString("uuencode", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	for (i = 0; i < 99; i++) {
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_set_filetype(ae, AE_IFREG);
		archive_entry_set_size(ae, datasize);
		snprintf(path, sizeof(path), "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used1));
	for (i = 0; i < 99; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		if (!assertEqualIntA(a, 0, archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualInt(ARCHIVE_FILTER_UU, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting name and mode
	 * options.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_uuencode(a));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "nonexistent-option", "0"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "99"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "name", "test.tar"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "mode", "0640"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 99; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used2));
	for (i = 0; i < 99; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		if (!assertEqualInt(0, archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualInt(ARCHIVE_FILTER_UU, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_uuencode(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_uuencode(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_uuencode(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_uuencode(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}